

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamReaderPrivate::OpenIndex(BamReaderPrivate *this,string *indexFilename)

{
  bool bVar1;
  string message;
  string bracError;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  bVar1 = BamRandomAccessController::OpenIndex(&this->m_randomAccessController,indexFilename,this);
  if (!bVar1) {
    BamRandomAccessController::GetErrorString_abi_cxx11_(&local_38,&this->m_randomAccessController);
    std::__cxx11::string::string((string *)&local_78,"could not open index: \n\t",&local_79);
    std::operator+(&local_58,&local_78,&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string((string *)&local_78,"BamReader::OpenIndex",&local_79);
    SetErrorString(this,&local_78,&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return bVar1;
}

Assistant:

bool BamReaderPrivate::OpenIndex(const std::string& indexFilename)
{

    if (m_randomAccessController.OpenIndex(indexFilename, this))
        return true;
    else {
        const std::string bracError = m_randomAccessController.GetErrorString();
        const std::string message = std::string("could not open index: \n\t") + bracError;
        SetErrorString("BamReader::OpenIndex", message);
        return false;
    }
}